

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPTCPTransmitter::Create
          (RTPTCPTransmitter *this,size_t maximumpacketsize,RTPTransmissionParams *transparams)

{
  RTPTransmissionParams *pRVar1;
  bool bVar2;
  TransmissionProtocol TVar3;
  RTPAbortDescriptors *pRVar4;
  undefined1 local_48 [4];
  int status;
  RTPTCPTransmissionParams defaultparams;
  RTPTCPTransmissionParams *params;
  RTPTransmissionParams *transparams_local;
  size_t maximumpacketsize_local;
  RTPTCPTransmitter *this_local;
  
  RTPTCPTransmissionParams::RTPTCPTransmissionParams((RTPTCPTransmissionParams *)local_48);
  if ((this->m_init & 1U) == 0) {
    this_local._4_4_ = -0xb5;
  }
  else if ((this->m_created & 1U) == 0) {
    if (transparams == (RTPTransmissionParams *)0x0) {
      pRVar1 = (RTPTransmissionParams *)local_48;
    }
    else {
      TVar3 = RTPTransmissionParams::GetTransmissionProtocol(transparams);
      pRVar1 = transparams;
      if (TVar3 != TCPProto) {
        this_local._4_4_ = -0xb8;
        goto LAB_0016306a;
      }
    }
    defaultparams.m_pAbortDesc = (RTPAbortDescriptors *)pRVar1;
    pRVar4 = RTPTCPTransmissionParams::GetCreatedAbortDescriptors
                       ((RTPTCPTransmissionParams *)defaultparams.m_pAbortDesc);
    if (pRVar4 == (RTPAbortDescriptors *)0x0) {
      this_local._4_4_ = RTPAbortDescriptors::Init(&this->m_abortDesc);
      if (this_local._4_4_ < 0) goto LAB_0016306a;
      this->m_pAbortDesc = &this->m_abortDesc;
    }
    else {
      pRVar4 = RTPTCPTransmissionParams::GetCreatedAbortDescriptors
                         ((RTPTCPTransmissionParams *)defaultparams.m_pAbortDesc);
      this->m_pAbortDesc = pRVar4;
      bVar2 = RTPAbortDescriptors::IsInitialized(this->m_pAbortDesc);
      if (!bVar2) {
        this_local._4_4_ = -0xae;
        goto LAB_0016306a;
      }
    }
    this->m_waitingForData = false;
    this->m_created = true;
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -0xb7;
  }
LAB_0016306a:
  RTPTCPTransmissionParams::~RTPTCPTransmissionParams((RTPTCPTransmissionParams *)local_48);
  return this_local._4_4_;
}

Assistant:

int RTPTCPTransmitter::Create(size_t maximumpacketsize, const RTPTransmissionParams *transparams)
{
	JRTPLIB_UNUSED(maximumpacketsize);
	const RTPTCPTransmissionParams *params,defaultparams;
	int status;

	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;
	
	MAINMUTEX_LOCK

	if (m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_ALREADYCREATED;
	}
	
	// Obtain transmission parameters
	
	if (transparams == 0)
		params = &defaultparams;
	else
	{
		if (transparams->GetTransmissionProtocol() != RTPTransmitter::TCPProto)
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_TCPTRANS_ILLEGALPARAMETERS;
		}
		params = static_cast<const RTPTCPTransmissionParams *>(transparams);
	}

	if (!params->GetCreatedAbortDescriptors())
	{
		if ((status = m_abortDesc.Init()) < 0)
		{
			MAINMUTEX_UNLOCK
			return status;
		}
		m_pAbortDesc = &m_abortDesc;
	}
	else
	{
		m_pAbortDesc = params->GetCreatedAbortDescriptors();
		if (!m_pAbortDesc->IsInitialized())
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_ABORTDESC_NOTINIT;
		}
	}

	m_waitingForData = false;
	m_created = true;
	MAINMUTEX_UNLOCK 
	return 0;
}